

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidLoop2(void)

{
  RepeatedField<long> *this;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  int iVar1;
  uint uVar2;
  Rep *pRVar3;
  ulong uVar4;
  TypeUnion TVar5;
  bool bVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  long *plVar9;
  FeatureDescription *pFVar10;
  ActivationReLU *pAVar11;
  LayerUnion LVar12;
  NeuralNetwork *pNVar13;
  NeuralNetworkLayer *pNVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  void *pvVar16;
  CopyLayerParams *pCVar17;
  ostream *poVar18;
  long lVar19;
  undefined8 *puVar20;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar21;
  Arena *pAVar22;
  Model m;
  Result res;
  NeuralNetwork nnBody;
  NeuralNetwork nnCondition;
  Model local_130;
  Result local_100;
  NeuralNetwork local_d8;
  NeuralNetwork local_80;
  
  CoreML::Specification::Model::Model(&local_130,(Arena *)0x0,false);
  if (local_130.description_ == (ModelDescription *)0x0) {
    pAVar22 = (Arena *)(local_130.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_130.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    local_130.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar22);
  }
  pRVar3 = ((local_130.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00187b41:
    pRVar21 = &(local_130.description_)->input_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar21->super_RepeatedPtrFieldBase).arena_);
    pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar21->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar1 = ((local_130.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00187b41;
    ((local_130.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar16 = pRVar3->elements[iVar1];
  }
  puVar20 = (undefined8 *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
    puVar20 = (undefined8 *)*puVar20;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar16 + 0x10),"A",puVar20);
  pFVar7 = *(FeatureType **)((long)pvVar16 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar16 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar22);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
    pFVar7 = *(FeatureType **)((long)pvVar16 + 0x20);
    if (pFVar7 == (FeatureType *)0x0) {
      pAVar22 = (Arena *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
      if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
        pAVar22 = *(Arena **)pAVar22;
      }
      pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                         (pAVar22);
      *(FeatureType **)((long)pvVar16 + 0x20) = pFVar7;
    }
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar22);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  this = &pAVar8->shape_;
  uVar2 = (pAVar8->shape_).current_size_;
  if (uVar2 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
    plVar9 = google::protobuf::RepeatedField<long>::elements(this);
    plVar9[uVar2] = 1;
  }
  else {
    plVar9 = google::protobuf::RepeatedField<long>::elements(this);
    plVar9[uVar2] = 1;
  }
  this->current_size_ = uVar2 + 1;
  if (local_130.description_ == (ModelDescription *)0x0) {
    pAVar22 = (Arena *)(local_130.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_130.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    local_130.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar22);
  }
  pRVar3 = ((local_130.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00187cc7:
    pRVar21 = &(local_130.description_)->output_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar21->super_RepeatedPtrFieldBase).arena_);
    pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar21->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar1 = ((local_130.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00187cc7;
    ((local_130.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar16 = pRVar3->elements[iVar1];
  }
  puVar20 = (undefined8 *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
    puVar20 = (undefined8 *)*puVar20;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar16 + 0x10),"B",puVar20);
  pFVar7 = *(FeatureType **)((long)pvVar16 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar16 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar16 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar16 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar22);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  CoreML::Specification::NeuralNetwork::NeuralNetwork(&local_80,(Arena *)0x0,false);
  if ((local_80.layers_.super_RepeatedPtrFieldBase.rep_ == (Rep *)0x0) ||
     (lVar19 = (long)local_80.layers_.super_RepeatedPtrFieldBase.current_size_,
     (local_80.layers_.super_RepeatedPtrFieldBase.rep_)->allocated_size <=
     local_80.layers_.super_RepeatedPtrFieldBase.current_size_)) {
    pNVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        (local_80.layers_.super_RepeatedPtrFieldBase.arena_);
    pNVar14 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&local_80.layers_.super_RepeatedPtrFieldBase,pNVar14);
  }
  else {
    local_80.layers_.super_RepeatedPtrFieldBase.current_size_ =
         local_80.layers_.super_RepeatedPtrFieldBase.current_size_ + 1;
    pNVar14 = (NeuralNetworkLayer *)
              (local_80.layers_.super_RepeatedPtrFieldBase.rep_)->elements[lVar19];
  }
  if (pNVar14->_oneof_case_[0] == 0x33e) {
    LVar12 = pNVar14->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar14);
    pNVar14->_oneof_case_[0] = 0x33e;
    uVar4 = (pNVar14->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    LVar12.greaterthan_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::GreaterThanLayerParams>
                   (pAVar22);
    (pNVar14->layer_).greaterthan_ = (GreaterThanLayerParams *)LVar12;
  }
  ((LVar12.convolution_)->kernelsize_).current_size_ = 0x3f800000;
  uVar4 = (pNVar14->super_MessageLite)._internal_metadata_.ptr_;
  puVar20 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar20 = (undefined8 *)*puVar20;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar14->name_,"cond",puVar20);
  pRVar3 = (pNVar14->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00187e48:
    pbVar15 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar14->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar14->input_).super_RepeatedPtrFieldBase,pbVar15);
  }
  else {
    iVar1 = (pNVar14->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00187e48;
    (pNVar14->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar16 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar16,0,*(char **)((long)pvVar16 + 8),0x3975b4);
  pRVar3 = (pNVar14->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00187e98:
    pbVar15 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar14->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar14->output_).super_RepeatedPtrFieldBase,pbVar15);
  }
  else {
    iVar1 = (pNVar14->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00187e98;
    (pNVar14->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar16 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar16,0,*(char **)((long)pvVar16 + 8),0x397c4b);
  CoreML::Specification::NeuralNetwork::NeuralNetwork(&local_d8,(Arena *)0x0,false);
  if ((local_d8.layers_.super_RepeatedPtrFieldBase.rep_ == (Rep *)0x0) ||
     (lVar19 = (long)local_d8.layers_.super_RepeatedPtrFieldBase.current_size_,
     (local_d8.layers_.super_RepeatedPtrFieldBase.rep_)->allocated_size <=
     local_d8.layers_.super_RepeatedPtrFieldBase.current_size_)) {
    pNVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        (local_d8.layers_.super_RepeatedPtrFieldBase.arena_);
    pNVar14 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&local_d8.layers_.super_RepeatedPtrFieldBase,pNVar14);
  }
  else {
    local_d8.layers_.super_RepeatedPtrFieldBase.current_size_ =
         local_d8.layers_.super_RepeatedPtrFieldBase.current_size_ + 1;
    pNVar14 = (NeuralNetworkLayer *)
              (local_d8.layers_.super_RepeatedPtrFieldBase.rep_)->elements[lVar19];
  }
  if (pNVar14->_oneof_case_[0] == 0x82) {
    LVar12 = pNVar14->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar14);
    pNVar14->_oneof_case_[0] = 0x82;
    uVar4 = (pNVar14->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    LVar12.activation_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationParams>
                   (pAVar22);
    (pNVar14->layer_).activation_ = (ActivationParams *)LVar12;
  }
  if (*(int *)((long)&((LVar12.convolution_)->kernelsize_).arena_or_elements_ + 4) != 10) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(LVar12.activation_);
    *(undefined4 *)((long)&((LVar12.convolution_)->kernelsize_).arena_or_elements_ + 4) = 10;
    uVar4 = ((LVar12.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationReLU>
                        (pAVar22);
    ((LVar12.activation_)->NonlinearityType_).relu_ = pAVar11;
  }
  uVar4 = (pNVar14->super_MessageLite)._internal_metadata_.ptr_;
  puVar20 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar20 = (undefined8 *)*puVar20;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar14->name_,"relu",puVar20);
  pRVar3 = (pNVar14->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00187fd3:
    pbVar15 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar14->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar14->input_).super_RepeatedPtrFieldBase,pbVar15);
  }
  else {
    iVar1 = (pNVar14->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00187fd3;
    (pNVar14->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar16 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar16,0,*(char **)((long)pvVar16 + 8),0x3975b4);
  pRVar3 = (pNVar14->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00188023:
    pbVar15 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar14->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar14->output_).super_RepeatedPtrFieldBase,pbVar15);
  }
  else {
    iVar1 = (pNVar14->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00188023;
    (pNVar14->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar16 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar16,0,*(char **)((long)pvVar16 + 8),0x3b5c76);
  if (local_130._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_130);
    local_130._oneof_case_[0] = 500;
    pAVar22 = (Arena *)(local_130.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_130.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    local_130.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar22);
  }
  TVar5 = local_130.Type_;
  (local_130.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_130.Type_.pipeline_)->models_;
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_130.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001880c2:
    pNVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar14 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar14);
  }
  else {
    iVar1 = (local_130.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_001880c2;
    (local_130.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar14 = (NeuralNetworkLayer *)pRVar3->elements[iVar1];
  }
  uVar4 = (pNVar14->super_MessageLite)._internal_metadata_.ptr_;
  puVar20 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar20 = (undefined8 *)*puVar20;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar14->name_,"for_loop",puVar20);
  if (pNVar14->_oneof_case_[0] == 0x267) {
    LVar12 = pNVar14->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar14);
    pNVar14->_oneof_case_[0] = 0x267;
    uVar4 = (pNVar14->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    LVar12.loop_ = google::protobuf::Arena::
                   CreateMaybeMessage<CoreML::Specification::LoopLayerParams>(pAVar22);
    (pNVar14->layer_).loop_ = (LoopLayerParams *)LVar12;
  }
  pNVar13 = (LVar12.loop_)->bodynetwork_;
  if (pNVar13 == (NeuralNetwork *)0x0) {
    uVar4 = ((LVar12.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pNVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>
                        (pAVar22);
    (LVar12.loop_)->bodynetwork_ = pNVar13;
  }
  CoreML::Specification::NeuralNetwork::CopyFrom(pNVar13,&local_d8);
  pNVar13 = (NeuralNetwork *)(LVar12.innerproduct_)->bias_;
  if (pNVar13 == (NeuralNetwork *)0x0) {
    uVar4 = ((LVar12.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pNVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>
                        (pAVar22);
    (LVar12.branch_)->elsebranch_ = pNVar13;
  }
  CoreML::Specification::NeuralNetwork::CopyFrom(pNVar13,&local_80);
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(TVar5.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001881d2:
    pNVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar14 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar14);
  }
  else {
    iVar1 = (TVar5.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_001881d2;
    (TVar5.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar14 = (NeuralNetworkLayer *)pRVar3->elements[iVar1];
  }
  uVar4 = (pNVar14->super_MessageLite)._internal_metadata_.ptr_;
  puVar20 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar20 = (undefined8 *)*puVar20;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar14->name_,"copy",puVar20);
  pRVar3 = (pNVar14->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00188229:
    pbVar15 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar14->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar14->input_).super_RepeatedPtrFieldBase,pbVar15);
  }
  else {
    iVar1 = (pNVar14->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_00188229;
    (pNVar14->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar16 = pRVar3->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar16,0,*(char **)((long)pvVar16 + 8),0x3975b4);
  pRVar3 = (pNVar14->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 != (Rep *)0x0) {
    iVar1 = (pNVar14->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar3->allocated_size) {
      (pNVar14->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar16 = pRVar3->elements[iVar1];
      goto LAB_00188293;
    }
  }
  pbVar15 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar14->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar16 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar14->output_).super_RepeatedPtrFieldBase,pbVar15);
LAB_00188293:
  std::__cxx11::string::_M_replace((ulong)pvVar16,0,*(char **)((long)pvVar16 + 8),0x3b5c76);
  if (pNVar14->_oneof_case_[0] != 600) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar14);
    pNVar14->_oneof_case_[0] = 600;
    uVar4 = (pNVar14->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pCVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::CopyLayerParams>
                        (pAVar22);
    (pNVar14->layer_).copy_ = pCVar17;
  }
  CoreML::validate<(MLModelType)500>(&local_100,&local_130);
  bVar6 = CoreML::Result::good(&local_100);
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x11e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_message._M_dataplus._M_p != &local_100.m_message.field_2) {
    operator_delete(local_100.m_message._M_dataplus._M_p,
                    local_100.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::NeuralNetwork::~NeuralNetwork(&local_d8);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork(&local_80);
  CoreML::Specification::Model::~Model(&local_130);
  return (uint)bVar6;
}

Assistant:

int testInvalidLoop2() {
    /*
     condition network present but no condition variable
     */
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();

    Specification::NeuralNetwork nnCondition;
    auto *l1 = nnCondition.add_layers();
    l1->mutable_greaterthan()->set_alpha(1.0);
    l1->set_name("cond");
    l1->add_input("A");
    l1->add_output("cond");

    Specification::NeuralNetwork nnBody;
    auto *l2 = nnBody.add_layers();
    (void)l2->mutable_activation()->mutable_relu();
    l2->set_name("relu");
    l2->add_input("A");
    l2->add_output("B");

    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l3 = nnMain->add_layers();
    l3->set_name("for_loop");
    auto *loop_params = l3->mutable_loop();
    loop_params->mutable_bodynetwork()->CopyFrom(nnBody);
    loop_params->mutable_conditionnetwork()->CopyFrom(nnCondition);

    auto *l4 = nnMain->add_layers();
    l4->set_name("copy");
    l4->add_input("A");
    l4->add_output("B");
    (void) l4->mutable_copy();

    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}